

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

Opnd * __thiscall IR::Opnd::CloneUse(Opnd *this,Func *func)

{
  bool bVar1;
  PropertySymOpnd *pPVar2;
  IndirOpnd *pIVar3;
  ArrayRegOpnd *pAVar4;
  Opnd *pOVar5;
  SymOpnd *pSVar6;
  RegOpnd *pRVar7;
  
  switch(this->m_kind) {
  case OpndKindSym:
    break;
  case OpndKindReg:
    bVar1 = RegOpnd::IsArrayRegOpnd((RegOpnd *)this);
    if (bVar1) {
      pAVar4 = ArrayRegOpnd::CloneUseInternalSub((ArrayRegOpnd *)this,func);
      return (Opnd *)pAVar4;
    }
    pRVar7 = RegOpnd::CloneUseInternal((RegOpnd *)this,func);
    return &pRVar7->super_Opnd;
  default:
    pOVar5 = Copy(this,func);
    return pOVar5;
  case OpndKindIndir:
    pIVar3 = IndirOpnd::CloneUseInternal((IndirOpnd *)this,func);
    return &pIVar3->super_Opnd;
  case OpndKindList:
    pOVar5 = ListOpnd::CloneUseInternal((ListOpnd *)this,func);
    return pOVar5;
  }
  bVar1 = SymOpnd::IsPropertySymOpnd((SymOpnd *)this);
  if (bVar1) {
    pPVar2 = PropertySymOpnd::CopyInternalSub((PropertySymOpnd *)this,func);
    return (Opnd *)pPVar2;
  }
  pSVar6 = SymOpnd::CloneUseInternal((SymOpnd *)this,func);
  return &pSVar6->super_Opnd;
}

Assistant:

Opnd *
Opnd::CloneUse(Func *func)
{
    switch (this->m_kind)
    {
    case OpndKindSym:
        if ((*static_cast<SymOpnd*>(this)).IsPropertySymOpnd())
        {
            return static_cast<PropertySymOpnd*>(this)->CloneUseInternalSub(func);
        }
        return static_cast<SymOpnd*>(this)->CloneUseInternal(func);

    case OpndKindReg:
        if ((*static_cast<RegOpnd*>(this)).IsArrayRegOpnd())
        {
            return static_cast<ArrayRegOpnd*>(this)->CloneUseInternalSub(func);
        }
        return static_cast<RegOpnd*>(this)->CloneUseInternal(func);

    case OpndKindIndir:
        return static_cast<IndirOpnd*>(this)->CloneUseInternal(func);

    case OpndKindList:
        return static_cast<ListOpnd*>(this)->CloneUseInternal(func);

    default:
        return this->Copy(func);
    };
}